

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack20_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0xfffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x14;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *puVar2 >> 8 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[2] & 0xffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[2] >> 0x10;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xf) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 4 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[4] & 0xfff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[5] & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[5] >> 0x14;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0xff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 8 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[7] & 0xffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[7] >> 0x10;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0xf) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 4 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[9] & 0xfff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[9] >> 0xc;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[10] & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[10] >> 0x14;
  puVar2 = in + 0xb;
  *puVar1 = (*puVar2 & 0xff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = *puVar2 >> 8 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0xc] & 0xffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0xc] >> 0x10;
  puVar2 = in + 0xd;
  *puVar1 = (*puVar2 & 0xf) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = *puVar2 >> 4 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[0xe] & 0xfff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0xe] >> 0xc;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0xf] & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = in[0xf] >> 0x14;
  puVar2 = in + 0x10;
  *puVar1 = (*puVar2 & 0xff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = *puVar2 >> 8 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0x11] & 0xffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = in[0x11] >> 0x10;
  puVar2 = in + 0x12;
  *puVar1 = (*puVar2 & 0xf) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = *puVar2 >> 4 & 0xfffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[0x13] & 0xfff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1f;
  *puVar1 = in[0x13] >> 0xc;
  *puVar1 = base + *puVar1;
  return in + 0x14;
}

Assistant:

uint32_t * unpack20_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}